

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::RenderPassCreateInfo::RenderPassCreateInfo
          (RenderPassCreateInfo *this,deUint32 _attachmentCount,
          VkAttachmentDescription *_pAttachments,deUint32 _subpassCount,
          VkSubpassDescription *_pSubpasses,deUint32 _dependencyCount,
          VkSubpassDependency *_pDependiences)

{
  vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_> *__s;
  pointer pSVar1;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *pvVar2;
  deUint32 dVar3;
  pointer pVVar4;
  pointer pVVar5;
  pointer pVVar6;
  allocator_type local_81;
  _Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> local_80;
  deUint32 local_64;
  vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_> *local_60;
  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> *local_58;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *local_50;
  vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_> *local_48;
  vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_> *local_40;
  vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
  *local_38;
  
  __s = &this->m_attachments;
  local_40 = &this->m_subpasses;
  local_48 = &this->m_dependiences;
  local_58 = &this->m_attachmentsStructs;
  local_50 = &this->m_subpassesStructs;
  local_60 = &this->m_dependiencesStructs;
  local_64 = _dependencyCount;
  memset(__s,0,0x90);
  local_38 = __s;
  std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>::
  vector<vk::VkAttachmentDescription_const*,void>
            ((vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>
              *)&local_80,_pAttachments,_pAttachments + _attachmentCount,&local_81);
  std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>::
  _M_move_assign(__s,&local_80);
  std::
  _Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
  ::~_Vector_base((_Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                   *)&local_80);
  std::vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>>::
  vector<vk::VkSubpassDescription_const*,void>
            ((vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>> *)
             &local_80,_pSubpasses,_pSubpasses + _subpassCount,(allocator_type *)&local_81);
  std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>::
  _M_move_assign(local_40,&local_80);
  std::vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>::
  ~vector((vector<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_> *)
          &local_80);
  std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>::
  vector<vk::VkSubpassDependency_const*,void>
            ((vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>> *)
             &local_80,_pDependiences,_pDependiences + local_64,(allocator_type *)&local_81);
  std::vector<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
  _M_move_assign(local_48,&local_80);
  std::_Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>::
  ~_Vector_base((_Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
                 *)&local_80);
  pvVar2 = local_50;
  std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::AttachmentDescription*,std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>>,void>
            ((vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>> *)
             &local_80,
             (this->m_attachments).
             super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_attachments).
             super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_81);
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
  _M_move_assign(local_58,&local_80);
  std::_Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
  ~_Vector_base((_Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                 *)&local_80);
  std::vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDescription*,std::vector<vkt::Draw::SubpassDescription,std::allocator<vkt::Draw::SubpassDescription>>>,void>
            ((vector<vk::VkSubpassDescription,std::allocator<vk::VkSubpassDescription>> *)&local_80,
             (this->m_subpasses).
             super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_subpasses).
             super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_81);
  std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::_M_move_assign
            (pvVar2,&local_80);
  std::_Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::
  ~_Vector_base(&local_80);
  std::vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::SubpassDependency*,std::vector<vkt::Draw::SubpassDependency,std::allocator<vkt::Draw::SubpassDependency>>>,void>
            ((vector<vk::VkSubpassDependency,std::allocator<vk::VkSubpassDependency>> *)&local_80,
             (this->m_dependiences).
             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_dependiences).
             super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
             ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_81);
  std::vector<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::_M_move_assign
            (local_60,&local_80);
  std::_Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>::
  ~_Vector_base((_Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_> *)
                &local_80);
  (this->super_VkRenderPassCreateInfo).sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  (this->super_VkRenderPassCreateInfo).pNext = (void *)0x0;
  (this->super_VkRenderPassCreateInfo).flags = 0;
  pSVar1 = (this->m_subpasses).
           super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  dVar3 = (deUint32)
          (((long)(this->m_attachments).
                  super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_attachments).
                 super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x24);
  (this->super_VkRenderPassCreateInfo).attachmentCount = dVar3;
  pVVar6 = (pointer)0x0;
  pVVar5 = (pointer)0x0;
  if (dVar3 != 0) {
    pVVar5 = (this->m_attachmentsStructs).
             super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  (this->super_VkRenderPassCreateInfo).pAttachments = pVVar5;
  dVar3 = (deUint32)
          (((long)pSVar1 -
           (long)(this->m_subpasses).
                 super__Vector_base<vkt::Draw::SubpassDescription,_std::allocator<vkt::Draw::SubpassDescription>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0xb0);
  (this->super_VkRenderPassCreateInfo).subpassCount = dVar3;
  pVVar4 = (pointer)0x0;
  if (dVar3 != 0) {
    pVVar4 = (this->m_subpassesStructs).
             super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  (this->super_VkRenderPassCreateInfo).pSubpasses = pVVar4;
  dVar3 = (deUint32)
          (((long)(this->m_dependiences).
                  super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_dependiences).
                 super__Vector_base<vkt::Draw::SubpassDependency,_std::allocator<vkt::Draw::SubpassDependency>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x1c);
  (this->super_VkRenderPassCreateInfo).dependencyCount = dVar3;
  if (dVar3 != 0) {
    pVVar6 = (this->m_dependiencesStructs).
             super__Vector_base<vk::VkSubpassDependency,_std::allocator<vk::VkSubpassDependency>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  (this->super_VkRenderPassCreateInfo).pDependencies = pVVar6;
  return;
}

Assistant:

RenderPassCreateInfo::RenderPassCreateInfo (deUint32							_attachmentCount,
											const vk::VkAttachmentDescription*	_pAttachments,
											deUint32							_subpassCount,
											const vk::VkSubpassDescription*		_pSubpasses,
											deUint32							_dependencyCount,
											const vk::VkSubpassDependency*		_pDependiences)
{

	m_attachments	= std::vector<AttachmentDescription>(_pAttachments, _pAttachments + _attachmentCount);
	m_subpasses		= std::vector<SubpassDescription>(_pSubpasses, _pSubpasses + _subpassCount);
	m_dependiences	= std::vector<SubpassDependency>(_pDependiences, _pDependiences + _dependencyCount);

	m_attachmentsStructs	= std::vector<vk::VkAttachmentDescription>	(m_attachments.begin(),		m_attachments.end());
	m_subpassesStructs		= std::vector<vk::VkSubpassDescription>		(m_subpasses.begin(),		m_subpasses.end());
	m_dependiencesStructs	= std::vector<vk::VkSubpassDependency>		(m_dependiences.begin(),	m_dependiences.end());

	sType = vk::VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
	pNext = DE_NULL;
	flags = 0;

	attachmentCount = static_cast<deUint32>(m_attachments.size());

	if (attachmentCount) {
		pAttachments = &m_attachmentsStructs[0];
	}
	else
	{
		pAttachments = DE_NULL;
	}

	subpassCount = static_cast<deUint32>(m_subpasses.size());

	if (subpassCount) {
		pSubpasses = &m_subpassesStructs[0];
	}
	else
	{
		pSubpasses = DE_NULL;
	}

	dependencyCount = static_cast<deUint32>(m_dependiences.size());

	if (dependencyCount) {
		pDependencies = &m_dependiencesStructs[0];
	}
	else
	{
		pDependencies = DE_NULL;
	}
}